

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O0

void __thiscall
OptionParser::parseTimeOption
          (OptionParser *this,Network *network,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference s;
  InputError *pIVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8 [32];
  int local_1b8;
  allocator local_1b1;
  int seconds;
  string timeUnits;
  string local_190 [8];
  string timeStr;
  string local_168 [32];
  TimeOption local_148;
  undefined4 local_144;
  int option;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [32];
  Utilities local_100 [32];
  int local_e0;
  int i;
  Utilities local_d0 [32];
  string local_b0 [8];
  string value;
  string local_90 [8];
  string keyword;
  string local_70 [8];
  string s2;
  string local_50 [8];
  string s1;
  string *tokens;
  int nTokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokenList_local;
  Network *network_local;
  OptionParser *this_local;
  
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(tokenList);
  iVar2 = (int)sVar3;
  if (1 < iVar2) {
    s = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](tokenList,0);
    std::__cxx11::string::string(local_50);
    std::__cxx11::string::string(local_70);
    std::__cxx11::string::string(local_90);
    std::__cxx11::string::string(local_b0);
    Utilities::upperCase(local_d0,s);
    std::__cxx11::string::operator=(local_50,(string *)local_d0);
    std::__cxx11::string::~string((string *)local_d0);
    local_e0 = 1;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,w_DURATION);
    if (bVar1) {
      std::__cxx11::string::operator=(local_90,timeOptionKeywords[8]);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_50,w_STATISTIC);
      if (bVar1) {
        std::__cxx11::string::operator=(local_90,timeOptionKeywords[9]);
      }
      else {
        Utilities::upperCase(local_100,s + 0x20);
        std::__cxx11::string::operator=(local_70,(string *)local_100);
        std::__cxx11::string::~string((string *)local_100);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&option,
                       (char *)local_50);
        std::operator+(local_120,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&option)
        ;
        std::__cxx11::string::operator=(local_90,(string *)local_120);
        std::__cxx11::string::~string((string *)local_120);
        std::__cxx11::string::~string((string *)&option);
        local_e0 = 2;
      }
    }
    if (local_e0 < iVar2) {
      local_148 = Utilities::findFullMatch((string *)local_90,timeOptionKeywords);
      if ((int)local_148 < 0) {
        pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_168,local_90);
        InputError::InputError(pIVar4,3,(string *)local_168);
        __cxa_throw(pIVar4,&InputError::typeinfo,InputError::~InputError);
      }
      if (local_148 == REPORT_STATISTIC) {
        local_144 = 1;
      }
      else {
        std::__cxx11::string::string(local_190,(string *)(s + (long)local_e0 * 0x20));
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&seconds,"",&local_1b1);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
        local_e0 = local_e0 + 1;
        if (local_e0 < iVar2) {
          std::__cxx11::string::operator=((string *)&seconds,(string *)(s + (long)local_e0 * 0x20));
        }
        local_1b8 = Utilities::getSeconds((string *)local_190,(string *)&seconds);
        if (local_1b8 < 0) {
          pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
          std::operator+(local_1f8,(char *)local_190);
          std::operator+(local_1d8,local_1f8);
          InputError::InputError(pIVar4,7,local_1d8);
          __cxa_throw(pIVar4,&InputError::typeinfo,InputError::~InputError);
        }
        Options::setOption(&network->options,local_148,local_1b8);
        std::__cxx11::string::~string((string *)&seconds);
        std::__cxx11::string::~string(local_190);
        local_144 = 0;
      }
    }
    else {
      local_144 = 1;
    }
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void OptionParser::parseTimeOption(Network* network, vector<string>& tokenList)
{
    // ... check for enough tokens

    int nTokens = (int)tokenList.size();
    if ( nTokens < 2 ) return;
    string* tokens = &tokenList[0];

    // ... parse option keywords

    string s1, s2, keyword, value;
    s1 = Utilities::upperCase(tokens[0]);
    int i = 1;

    // ... check for single keyword option (for EPANET 2 compatibility)

    if (s1 == w_DURATION) keyword = timeOptionKeywords[Options::TOTAL_DURATION];
    else if (s1 == w_STATISTIC) keyword = timeOptionKeywords[Options::REPORT_STATISTIC];

    // ... otherwise form option keyword

    else
    {
        s2 = Utilities::upperCase(tokens[1]);
        keyword = s1 + "_" + s2;
        i = 2;
    }
    if ( i >= nTokens ) return;


    // ... find which time option we have

    int option = Utilities::findFullMatch(keyword, timeOptionKeywords);
    if ( option < 0 ) throw InputError(InputError::INVALID_KEYWORD, keyword);

    // ... skip STATISTIC option

    if (option == Options::REPORT_STATISTIC) return;

    // ... create strings to hold a time value and its units

    string timeStr = tokens[i];
    string timeUnits = "";
    if ( nTokens > ++i ) timeUnits = tokens[i];

    // ... convert time value string to seconds

    int seconds = Utilities::getSeconds(timeStr, timeUnits);
    if (seconds < 0)
    {
        throw InputError(InputError::INVALID_TIME, timeStr + " " + timeUnits);
    }
    network->options.setOption((Options::TimeOption)option, seconds);
}